

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stats.cpp
# Opt level: O0

potVec * __thiscall OpenMD::Stats::getPotVecAverage(Stats *this,int index)

{
  reference pvVar1;
  PotVecAccumulator *this_00;
  int in_EDX;
  long in_RSI;
  Vector<double,_7U> *in_RDI;
  potVec *value;
  ResultType *in_stack_ffffffffffffffb8;
  
  Vector<double,_7U>::Vector(in_RDI);
  pvVar1 = std::vector<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_>::
           operator[]((vector<OpenMD::Stats::StatsData,_std::allocator<OpenMD::Stats::StatsData>_> *
                      )(in_RSI + 0x18),(long)in_EDX);
  if (pvVar1->accumulator == (BaseAccumulator *)0x0) {
    this_00 = (PotVecAccumulator *)0x0;
  }
  else {
    this_00 = (PotVecAccumulator *)
              __dynamic_cast(pvVar1->accumulator,&BaseAccumulator::typeinfo,
                             &PotVecAccumulator::typeinfo,0);
  }
  PotVecAccumulator::getAverage(this_00,in_stack_ffffffffffffffb8);
  return in_RDI;
}

Assistant:

potVec Stats::getPotVecAverage(int index) {
    assert(index >= 0 && index < ENDINDEX);
    potVec value;
    dynamic_cast<PotVecAccumulator*>(data_[index].accumulator)
        ->getAverage(value);
    return value;
  }